

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

void __thiscall
cfg::tag_vector_t<cfgfile::string_trait_t>::tag_vector_t
          (tag_vector_t<cfgfile::string_trait_t> *this,vector_t *cfg)

{
  tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t> *in_RDI;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined8 in_stack_ffffffffffffff30;
  undefined1 is_mandatory;
  string_t *name;
  string_t *in_stack_ffffffffffffff38;
  tag_t<cfgfile::string_trait_t> *owner;
  undefined1 local_a9 [33];
  string local_88 [55];
  allocator local_51;
  string local_50 [24];
  vector_t *in_stack_ffffffffffffffc8;
  tag_vector_t<cfgfile::string_trait_t> *in_stack_ffffffffffffffd0;
  
  is_mandatory = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"vector",&local_51);
  cfgfile::string_trait_t::from_ascii
            ((string *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  cfgfile::tag_no_value_t<cfgfile::string_trait_t>::tag_no_value_t
            ((tag_no_value_t<cfgfile::string_trait_t> *)in_RDI,in_stack_ffffffffffffff38,
             (bool)is_mandatory);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  (in_RDI->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t =
       (_func_int **)&PTR__tag_vector_t_00179580;
  name = (string_t *)&in_RDI->m_tags;
  owner = (tag_t<cfgfile::string_trait_t> *)local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_a9 + 1),"vector",(allocator *)owner);
  cfgfile::string_trait_t::from_ascii
            ((string *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  cfgfile::tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>::
  tag_vector_of_tags_t(in_RDI,owner,name,(bool)in_stack_ffffffffffffff2f);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)(local_a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a9);
  set_cfg(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

explicit tag_vector_t( const vector_t & cfg )
		:	cfgfile::tag_no_value_t< Trait >( Trait::from_ascii( "vector" ), true )
		,	m_vector( *this, Trait::from_ascii( "vector" ), true )
	{
		set_cfg( cfg );
	}